

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O3

H265eDpbFrm * h265e_find_cpb_frame(H265eDpbFrm *frms,RK_S32 cnt,EncFrmStatus *frm)

{
  undefined8 in_RAX;
  ulong uVar1;
  undefined4 in_register_00000034;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  puVar2 = (ulong *)CONCAT44(in_register_00000034,cnt);
  uVar1 = *puVar2;
  if ((uVar1 & 1) != 0) {
    uVar4 = uVar1 >> 0x30;
    if (((byte)h265e_debug & 0x80) != 0) {
      _mpp_log_l(4,"h265e_dpb","frm %d start finding slot \n",(char *)0x0,uVar4);
    }
    lVar3 = 0;
    do {
      if ((*(char *)&frms->field_7 != '\0') &&
         ((short)((frms->status).val >> 0x30) == (short)(uVar1 >> 0x30) &&
          ((frms->status).val & 1) != 0)) {
        if (((byte)h265e_debug & 0x80) != 0) {
          uVar5 = CONCAT44(uVar6,1);
          _mpp_log_l(4,"h265e_dpb","frm %d match slot %d valid %d\n",(char *)0x0,uVar4,lVar3,uVar5);
          uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
        }
        if ((*puVar2 & 4) != 0) {
          return frms;
        }
        uVar1 = *puVar2 ^ (frms->status).val;
        if ((uVar1 & 0x40) != 0) {
          uVar5 = CONCAT44(uVar6,0x21e);
          _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "p->is_non_ref == frm->is_non_ref","h265e_find_cpb_frame",uVar5);
          uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001ca288;
          uVar1 = *puVar2 ^ (frms->status).val;
        }
        if ((char)uVar1 < '\0') {
          uVar5 = CONCAT44(uVar6,0x21f);
          _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "p->is_lt_ref == frm->is_lt_ref","h265e_find_cpb_frame",uVar5);
          uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001ca288;
          uVar1 = *puVar2 ^ (frms->status).val;
        }
        if ((uVar1 & 0xf00) != 0) {
          uVar5 = CONCAT44(uVar6,0x220);
          _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "p->lt_idx == frm->lt_idx","h265e_find_cpb_frame",uVar5);
          uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001ca288;
          uVar1 = *puVar2 ^ (frms->status).val;
        }
        if ((uVar1 & 0xf000) == 0) {
          return frms;
        }
        _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "p->temporal_id == frm->temporal_id","h265e_find_cpb_frame",CONCAT44(uVar6,0x221)
                  );
        if ((mpp_debug._3_1_ & 0x10) == 0) {
          return frms;
        }
LAB_001ca288:
        abort();
      }
      lVar3 = lVar3 + 1;
      frms = frms + 1;
    } while (lVar3 != 0x10);
    _mpp_log_l(2,"h265e_dpb","can not find match frm %d\n","h265e_find_cpb_frame",uVar4);
  }
  return (H265eDpbFrm *)0x0;
}

Assistant:

static H265eDpbFrm *h265e_find_cpb_frame(H265eDpbFrm *frms, RK_S32 cnt, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 i;

    if (!frm->valid)
        return NULL;

    h265e_dbg_dpb("frm %d start finding slot \n", frm->seq_idx);
    for (i = 0; i < cnt; i++) {
        if (!frms[i].dpb_used) {
            continue;
        }

        EncFrmStatus *p = &frms[i].status;

        if (p->valid && p->seq_idx == seq_idx) {
            h265e_dbg_dpb("frm %d match slot %d valid %d\n",
                          p->seq_idx, i, p->valid);
            if (frm->save_pass1)
                return &frms[i];
            mpp_assert(p->is_non_ref == frm->is_non_ref);
            mpp_assert(p->is_lt_ref == frm->is_lt_ref);
            mpp_assert(p->lt_idx == frm->lt_idx);
            mpp_assert(p->temporal_id == frm->temporal_id);
            return &frms[i];
        }
    }

    mpp_err_f("can not find match frm %d\n", seq_idx);

    return NULL;
}